

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<std::pair<QFileSystemModelPrivate::QFileSystemNode_*,_int>_>::relocate
          (QArrayDataPointer<std::pair<QFileSystemModelPrivate::QFileSystemNode_*,_int>_> *this,
          qsizetype offset,pair<QFileSystemModelPrivate::QFileSystemNode_*,_int> **data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<std::pair<QFileSystemModelPrivate::QFileSystemNode_*,_int>_> *in_RDI;
  pair<QFileSystemModelPrivate::QFileSystemNode_*,_int> **unaff_retaddr;
  pair<QFileSystemModelPrivate::QFileSystemNode_*,_int> *res;
  pair<QFileSystemModelPrivate::QFileSystemNode_*,_int> *first;
  QArrayDataPointer<std::pair<QFileSystemModelPrivate::QFileSystemNode_*,_int>_> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::
  q_relocate_overlap_n<std::pair<QFileSystemModelPrivate::QFileSystemNode*,int>,long_long>
            (first,(longlong)in_RDI,
             (pair<QFileSystemModelPrivate::QFileSystemNode_*,_int> *)0xabeb17);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<std::pair<QFileSystemModelPrivate::QFileSystemNode*,int>>,std::pair<QFileSystemModelPrivate::QFileSystemNode*,int>const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 0x10 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }